

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::GenChunkMaskTest_ValidMaskFromFields_Test::
~GenChunkMaskTest_ValidMaskFromFields_Test(GenChunkMaskTest_ValidMaskFromFields_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GenChunkMaskTest, ValidMaskFromFields) {
  const char* field_names[] = {"optional_int32"};

  auto fields = CreateFieldArray<TestAllTypes>(field_names);
  ASSERT_EQ(fields.size(), 1);
  ASSERT_EQ(fields[0]->index(), 0);

  const uint32_t kHasbitIdx = 3;
  uint32_t mask = GenChunkMask(fields, {kHasbitIdx});
  EXPECT_EQ(mask, 1 << kHasbitIdx);
}